

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmNinjaNormalTargetGenerator::cmNinjaNormalTargetGenerator
          (cmNinjaNormalTargetGenerator *this,cmGeneratorTarget *target)

{
  cmTarget *pcVar1;
  cmGeneratorTarget *target_00;
  int iVar2;
  string *psVar3;
  cmLocalNinjaGenerator *pcVar4;
  cmOSXBundleGenerator *this_00;
  string local_70;
  string local_50;
  allocator local_19;
  cmGeneratorTarget *local_18;
  cmGeneratorTarget *target_local;
  cmNinjaNormalTargetGenerator *this_local;
  
  local_18 = target;
  target_local = (cmGeneratorTarget *)this;
  cmNinjaTargetGenerator::cmNinjaTargetGenerator(&this->super_cmNinjaTargetGenerator,target);
  (this->super_cmNinjaTargetGenerator)._vptr_cmNinjaTargetGenerator =
       (_func_int **)&PTR__cmNinjaNormalTargetGenerator_00c18638;
  std::__cxx11::string::string((string *)&this->TargetNameOut);
  std::__cxx11::string::string((string *)&this->TargetNameSO);
  std::__cxx11::string::string((string *)&this->TargetNameReal);
  std::__cxx11::string::string((string *)&this->TargetNameImport);
  std::__cxx11::string::string((string *)&this->TargetNamePDB);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->TargetLinkLanguage,"",&local_19);
  std::allocator<char>::~allocator((allocator<char> *)&local_19);
  pcVar1 = local_18->Target;
  psVar3 = cmNinjaTargetGenerator::GetConfigName_abi_cxx11_(&this->super_cmNinjaTargetGenerator);
  cmTarget::GetLinkerLanguage(&local_50,pcVar1,psVar3);
  std::__cxx11::string::operator=((string *)&this->TargetLinkLanguage,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  iVar2 = cmGeneratorTarget::GetType(local_18);
  if (iVar2 == 0) {
    pcVar1 = local_18->Target;
    pcVar4 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
    psVar3 = cmLocalNinjaGenerator::GetConfigName_abi_cxx11_(pcVar4);
    cmTarget::GetExecutableNames
              (pcVar1,&this->TargetNameOut,&this->TargetNameReal,&this->TargetNameImport,
               &this->TargetNamePDB,psVar3);
  }
  else {
    pcVar1 = local_18->Target;
    pcVar4 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
    psVar3 = cmLocalNinjaGenerator::GetConfigName_abi_cxx11_(pcVar4);
    cmTarget::GetLibraryNames
              (pcVar1,&this->TargetNameOut,&this->TargetNameSO,&this->TargetNameReal,
               &this->TargetNameImport,&this->TargetNamePDB,psVar3);
  }
  iVar2 = cmGeneratorTarget::GetType(local_18);
  if (iVar2 != 4) {
    pcVar1 = local_18->Target;
    psVar3 = cmNinjaTargetGenerator::GetConfigName_abi_cxx11_(&this->super_cmNinjaTargetGenerator);
    cmTarget::GetDirectory(&local_70,pcVar1,psVar3,false);
    cmNinjaTargetGenerator::EnsureDirectoryExists(&this->super_cmNinjaTargetGenerator,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  this_00 = (cmOSXBundleGenerator *)operator_new(0x40);
  target_00 = local_18;
  psVar3 = cmNinjaTargetGenerator::GetConfigName_abi_cxx11_(&this->super_cmNinjaTargetGenerator);
  cmOSXBundleGenerator::cmOSXBundleGenerator(this_00,target_00,psVar3);
  (this->super_cmNinjaTargetGenerator).OSXBundleGenerator = this_00;
  cmOSXBundleGenerator::SetMacContentFolders
            ((this->super_cmNinjaTargetGenerator).OSXBundleGenerator,
             &(this->super_cmNinjaTargetGenerator).MacContentFolders);
  return;
}

Assistant:

cmNinjaNormalTargetGenerator::
cmNinjaNormalTargetGenerator(cmGeneratorTarget* target)
  : cmNinjaTargetGenerator(target)
  , TargetNameOut()
  , TargetNameSO()
  , TargetNameReal()
  , TargetNameImport()
  , TargetNamePDB()
  , TargetLinkLanguage("")
{
  this->TargetLinkLanguage = target->Target
                                   ->GetLinkerLanguage(this->GetConfigName());
  if (target->GetType() == cmTarget::EXECUTABLE)
    target->Target->GetExecutableNames(this->TargetNameOut,
                               this->TargetNameReal,
                               this->TargetNameImport,
                               this->TargetNamePDB,
                               GetLocalGenerator()->GetConfigName());
  else
    target->Target->GetLibraryNames(this->TargetNameOut,
                            this->TargetNameSO,
                            this->TargetNameReal,
                            this->TargetNameImport,
                            this->TargetNamePDB,
                            GetLocalGenerator()->GetConfigName());

  if(target->GetType() != cmTarget::OBJECT_LIBRARY)
    {
    // on Windows the output dir is already needed at compile time
    // ensure the directory exists (OutDir test)
    EnsureDirectoryExists(target->Target->GetDirectory(this->GetConfigName()));
    }

  this->OSXBundleGenerator = new cmOSXBundleGenerator(target,
                                                      this->GetConfigName());
  this->OSXBundleGenerator->SetMacContentFolders(&this->MacContentFolders);
}